

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O2

void __thiscall
libtorrent::bt_peer_connection::write_piece
          (bt_peer_connection *this,peer_request *r,disk_buffer_holder *buffer)

{
  int *__args_1;
  uint uVar1;
  element_type *peVar2;
  pointer pdVar3;
  pointer pdVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  list_type *this_00;
  vector<libtorrent::entry,std::allocator<libtorrent::entry>> *pvVar8;
  _Base_ptr p_Var9;
  alert_manager *paVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char cVar11;
  uint uVar12;
  disk_buffer_holder *this_01;
  bool bVar13;
  bool bVar14;
  span<const_char> buf;
  span<const_char> buf_00;
  span<const_char> buf_01;
  shared_ptr<libtorrent::torrent> t;
  vector<char,_std::allocator<char>_> piece_list_buf;
  char *local_128;
  peer_request *local_120;
  disk_buffer_holder *local_118;
  entry piece_list;
  char msg [17];
  char *ptr2;
  map<int,_libtorrent::digest32<160L>,_std::less<int>,_std::allocator<std::pair<const_int,_libtorrent::digest32<160L>_>_>_>
  merkle_node_list;
  disk_buffer_holder local_70;
  disk_buffer_holder local_50;
  
  local_118 = buffer;
  std::__weak_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
            ((__weak_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2> *)&piece_list,
             &(this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
              super___weak_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&t.super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>,
             (__weak_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2> *)&piece_list);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(piece_list.data.buffer + 8));
  peVar2 = ((t.super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super_torrent_hot_members).m_torrent_file.
           super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pdVar3 = (peVar2->m_merkle_tree).
           super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
           super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pdVar4 = (peVar2->m_merkle_tree).
           super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
           super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  iVar6 = r->start;
  local_128 = msg;
  detail::write_impl<int,int,char*>(r->length + 9,&local_128);
  bVar5 = aux::session_settings::get_bool
                    ((this->super_peer_connection).super_peer_connection_hot_members.m_settings,
                     0x8036);
  __args_1 = &r->length;
  bVar13 = pdVar3 == pdVar4;
  bVar14 = iVar6 != 0;
  cVar11 = -6;
  if (bVar13 || bVar14) {
    cVar11 = '\a';
  }
  if (!bVar5) {
    cVar11 = '\a';
  }
  *local_128 = cVar11;
  local_128 = local_128 + 1;
  detail::write_impl<int,int,char*>((r->piece).m_val,&local_128);
  detail::write_impl<int,int,char*>(r->start,&local_128);
  if (bVar13 || bVar14) {
    buf.m_len = 0xd;
    buf.m_ptr = msg;
    peer_connection::send_buffer(&this->super_peer_connection,buf);
  }
  else {
    piece_list_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    piece_list_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    piece_list_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    entry::entry(&piece_list);
    this_00 = entry::list(&piece_list);
    libtorrent::torrent_info::build_merkle_list
              (&merkle_node_list,
               ((t.super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               super_torrent_hot_members).m_torrent_file.
               super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (piece_index_t)(r->piece).m_val);
    local_120 = r;
    std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::reserve
              (this_00,merkle_node_list._M_t._M_impl.super__Rb_tree_header._M_node_count);
    for (p_Var9 = merkle_node_list._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var9 != &merkle_node_list._M_t._M_impl.super__Rb_tree_header;
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
      ptr2 = (char *)CONCAT44(ptr2._4_4_,2);
      std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::
      emplace_back<libtorrent::entry::data_type>(this_00,(data_type *)&ptr2);
      pvVar8 = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)
               entry::list((this_00->
                           super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>
                           )._M_impl.super__Vector_impl_data._M_finish + -1);
      std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::emplace_back<int_const&>
                (pvVar8,(int *)(p_Var9 + 1));
      pvVar8 = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)
               entry::list((this_00->
                           super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>
                           )._M_impl.super__Vector_impl_data._M_finish + -1);
      digest32<160l>::to_string_abi_cxx11_((string *)&ptr2,&p_Var9[1].field_0x4);
      std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
      emplace_back<std::__cxx11::string>(pvVar8,(string *)&ptr2);
      std::__cxx11::string::~string((string *)&ptr2);
    }
    bencode<std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
              (&piece_list_buf,&piece_list);
    detail::write_impl<int,int,char*>
              ((int)piece_list_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
               (int)piece_list_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,&local_128);
    ptr2 = msg;
    detail::write_impl<int,int,char*>
              (*__args_1 +
               ((int)piece_list_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (int)piece_list_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start) + 0xd,&ptr2);
    buf_00.m_len = 0x11;
    buf_00.m_ptr = msg;
    peer_connection::send_buffer(&this->super_peer_connection,buf_00);
    r = local_120;
    buf_01.m_len = (long)piece_list_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)piece_list_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    buf_01.m_ptr = piece_list_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
    peer_connection::send_buffer(&this->super_peer_connection,buf_01);
    std::
    _Rb_tree<int,_std::pair<const_int,_libtorrent::digest32<160L>_>,_std::_Select1st<std::pair<const_int,_libtorrent::digest32<160L>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_libtorrent::digest32<160L>_>_>_>
    ::~_Rb_tree(&merkle_node_list._M_t);
    entry::~entry(&piece_list);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&piece_list_buf.super__Vector_base<char,_std::allocator<char>_>);
  }
  if ((local_118->m_ref).cookie == 0x7fffffff) {
    this_01 = &local_50;
    disk_buffer_holder::disk_buffer_holder(this_01,local_118);
    peer_connection::append_send_buffer<libtorrent::disk_buffer_holder>
              (&this->super_peer_connection,this_01,*__args_1);
  }
  else {
    this_01 = &local_70;
    disk_buffer_holder::disk_buffer_holder(this_01,local_118);
    append_const_send_buffer<libtorrent::disk_buffer_holder>(this,this_01,*__args_1);
  }
  disk_buffer_holder::~disk_buffer_holder(this_01);
  piece_list.data.buffer._0_4_ = (this->super_peer_connection).m_send_buffer.m_bytes - *__args_1;
  std::
  vector<libtorrent::bt_peer_connection::range,std::allocator<libtorrent::bt_peer_connection::range>>
  ::emplace_back<int,int_const&>
            ((vector<libtorrent::bt_peer_connection::range,std::allocator<libtorrent::bt_peer_connection::range>>
              *)&this->m_payloads,(int *)&piece_list,__args_1);
  peer_connection::setup_send(&this->super_peer_connection);
  counters::inc_stats_counter((this->super_peer_connection).m_counters,0x5d,1);
  paVar10 = torrent::alerts(t.super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr);
  if (((paVar10->m_alert_mask)._M_i.m_val & 0x800080) != 0) {
    paVar10 = torrent::alerts(t.super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
    torrent::get_handle((torrent *)&piece_list);
    iVar6 = (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x12])
                      (this);
    iVar7 = (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0xd])
                      (this);
    uVar1 = ((((t.super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_torrent_hot_members).m_torrent_file.
              super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            m_files).m_piece_length;
    uVar12 = 0x4000;
    if (uVar1 < 0x4000) {
      uVar12 = uVar1;
    }
    if ((int)uVar1 < 1) {
      uVar12 = 0x4000;
    }
    merkle_node_list._M_t._M_impl._0_4_ = r->start / (int)uVar12;
    alert_manager::
    emplace_alert<libtorrent::block_uploaded_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,libtorrent::digest32<160l>const&,int,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&>
              (paVar10,(torrent_handle *)&piece_list,
               (basic_endpoint<boost::asio::ip::tcp> *)CONCAT44(extraout_var,iVar6),
               (digest32<160L> *)CONCAT44(extraout_var_00,iVar7),(int *)&merkle_node_list,&r->piece)
    ;
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(piece_list.data.buffer + 8));
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&t.super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void bt_peer_connection::write_piece(peer_request const& r, disk_buffer_holder buffer)
	{
		INVARIANT_CHECK;

		TORRENT_ASSERT(m_sent_handshake);
		TORRENT_ASSERT(m_sent_bitfield);

		std::shared_ptr<torrent> t = associated_torrent().lock();
		TORRENT_ASSERT(t);

		bool merkle = t->torrent_file().is_merkle_torrent() && r.start == 0;
	// the hash piece looks like this:
	// uint8_t  msg
	// uint32_t piece index
	// uint32_t start
	// uint32_t list len
	// var      bencoded list
	// var      piece data
		char msg[4 + 1 + 4 + 4 + 4];
		char* ptr = msg;
		TORRENT_ASSERT(r.length <= 16 * 1024);
		detail::write_int32(r.length + 1 + 4 + 4, ptr);
		if (m_settings.get_bool(settings_pack::support_merkle_torrents) && merkle)
			detail::write_uint8(250, ptr);
		else
			detail::write_uint8(msg_piece, ptr);
		detail::write_int32(static_cast<int>(r.piece), ptr);
		detail::write_int32(r.start, ptr);

		// if this is a merkle torrent and the start offset
		// is 0, we need to include the merkle node hashes
		if (merkle)
		{
			std::vector<char> piece_list_buf;
			entry piece_list;
			entry::list_type& l = piece_list.list();
			std::map<int, sha1_hash> merkle_node_list = t->torrent_file().build_merkle_list(r.piece);
			l.reserve(merkle_node_list.size());
			for (auto const& i : merkle_node_list)
			{
				l.emplace_back(entry::list_t);
				l.back().list().emplace_back(i.first);
				l.back().list().emplace_back(i.second.to_string());
			}
			bencode(std::back_inserter(piece_list_buf), piece_list);
			detail::write_int32(int(piece_list_buf.size()), ptr);

			// back-patch the length field
			char* ptr2 = msg;
			detail::write_int32(r.length + 1 + 4 + 4 + 4 + int(piece_list_buf.size())
				, ptr2);

			send_buffer({msg, 17});
			send_buffer(piece_list_buf);
		}
		else
		{
			send_buffer({msg, 13});
		}

		if (buffer.is_mutable())
		{
			append_send_buffer(std::move(buffer), r.length);
		}
		else
		{
			append_const_send_buffer(std::move(buffer), r.length);
		}

		m_payloads.emplace_back(send_buffer_size() - r.length, r.length);
		setup_send();

		stats_counters().inc_stats_counter(counters::num_outgoing_piece);

		if (t->alerts().should_post<block_uploaded_alert>())
		{
			t->alerts().emplace_alert<block_uploaded_alert>(t->get_handle(),
				remote(), pid(), r.start / t->block_size() , r.piece);
		}
	}